

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

float tcu::linearChannelToSRGB(float cl)

{
  float fVar1;
  undefined4 local_c;
  float cl_local;
  
  if (0.0 < cl) {
    if (0.0031308 <= cl) {
      if (1.0 <= cl) {
        local_c = 1.0;
      }
      else {
        fVar1 = deFloatPow(cl,0.41666);
        local_c = fVar1 * 1.055 + -0.055;
      }
    }
    else {
      local_c = cl * 12.92;
    }
  }
  else {
    local_c = 0.0;
  }
  return local_c;
}

Assistant:

static inline float linearChannelToSRGB (float cl)
{
	if (cl <= 0.0f)
		return 0.0f;
	else if (cl < 0.0031308f)
		return 12.92f*cl;
	else if (cl < 1.0f)
		return 1.055f*deFloatPow(cl, 0.41666f) - 0.055f;
	else
		return 1.0f;
}